

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgbaThreading.cpp
# Opt level: O0

void anon_unknown.dwarf_1c7b77::writeReadRGBA
               (char *fileName,int width,int height,Array2D<Imf_2_5::Rgba> *p1,RgbaChannels channels
               ,LineOrder lorder,Compression comp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  LineOrder LVar4;
  Compression CVar5;
  RgbaChannels width_00;
  Compression CVar6;
  Compression CVar7;
  ostream *poVar8;
  void *this;
  LineOrder *pLVar9;
  Compression *pCVar10;
  Box2i *pBVar11;
  float *pfVar12;
  V2f *v;
  Rgba *pRVar13;
  Array2D<Imf_2_5::Rgba> *in_RCX;
  int in_EDX;
  char *pcVar14;
  char *in_RDI;
  RgbaChannels in_R8D;
  LineOrder in_R9D;
  float fVar15;
  float fVar16;
  Compression in_stack_00000008;
  int x;
  int y;
  Array2D<Imf_2_5::Rgba> p2;
  int dy;
  int dx;
  int h;
  int w;
  Box2i *dw;
  RgbaInputFile in;
  int numWrite;
  int numLeft;
  RgbaOutputFile out;
  Header header;
  undefined4 in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc4;
  RgbaInputFile *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  float in_stack_fffffffffffffdd4;
  undefined8 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined8 in_stack_fffffffffffffdf8;
  RgbaChannels channels_00;
  LineOrder in_stack_fffffffffffffe00;
  float in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  float in_stack_fffffffffffffe14;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int local_108;
  int local_104;
  Vec2<float> local_100 [3];
  size_t in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int iVar17;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  RgbaOutputFile *in_stack_ffffffffffffff30;
  int local_8c;
  RgbaChannels in_stack_ffffffffffffff7c;
  Array2D<Imf_2_5::Rgba> *in_stack_ffffffffffffff80;
  Array2D<Imf_2_5::Rgba> *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  size_t in_stack_ffffffffffffff98;
  Vec2<float> in_stack_ffffffffffffffa0;
  Rgba *in_stack_ffffffffffffffa8;
  RgbaInputFile *in_stack_ffffffffffffffb0;
  
  poVar8 = std::operator<<((ostream *)&std::cout,"channels ");
  pcVar14 = "";
  if ((in_R8D & WRITE_R) != 0) {
    pcVar14 = "R";
  }
  poVar8 = std::operator<<(poVar8,pcVar14);
  pcVar14 = "";
  if ((in_R8D & WRITE_G) != 0) {
    pcVar14 = "G";
  }
  poVar8 = std::operator<<(poVar8,pcVar14);
  pcVar14 = "";
  if ((in_R8D & WRITE_B) != 0) {
    pcVar14 = "B";
  }
  poVar8 = std::operator<<(poVar8,pcVar14);
  pcVar14 = "";
  if ((in_R8D & WRITE_A) != 0) {
    pcVar14 = "A";
  }
  poVar8 = std::operator<<(poVar8,pcVar14);
  poVar8 = std::operator<<(poVar8,", line order ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,in_R9D);
  poVar8 = std::operator<<(poVar8,", compression ");
  this = (void *)std::ostream::operator<<(poVar8,in_stack_00000008);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Vec2<float>::Vec2((Vec2<float> *)&stack0xffffffffffffffa0,0.0,0.0);
  Imf_2_5::Header::Header
            ((Header *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(int)in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe14,
             (V2f *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,
             (Compression)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
  pLVar9 = Imf_2_5::Header::lineOrder((Header *)0x1f61ac);
  *pLVar9 = in_R9D;
  pCVar10 = Imf_2_5::Header::compression((Header *)0x1f61e2);
  *pCVar10 = in_stack_00000008;
  remove(in_RDI);
  Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             in_stack_fffffffffffffe28,
             (Header *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (RgbaChannels)((ulong)in_stack_fffffffffffffe18 >> 0x20),(int)in_stack_fffffffffffffe18
            );
  Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](in_RCX,0);
  Imf_2_5::RgbaOutputFile::setFrameBuffer
            (in_stack_ffffffffffffff30,
             (Rgba *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18
            );
  for (local_8c = in_EDX; channels_00 = (RgbaChannels)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
      local_8c != 0; local_8c = local_8c - (int)(fVar15 * (float)local_8c + 0.5)) {
    fVar15 = (float)Imath_2_5::Rand32::nextf();
    Imf_2_5::RgbaOutputFile::writePixels
              ((RgbaOutputFile *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
  }
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile
            ((RgbaOutputFile *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile
            ((RgbaInputFile *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             (int)in_stack_fffffffffffffe04);
  pBVar11 = Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)0x1f63d5);
  iVar2 = ((pBVar11->max).x - (pBVar11->min).x) + 1;
  iVar3 = ((pBVar11->max).y - (pBVar11->min).y) + 1;
  iVar17 = (pBVar11->min).y;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D
            ((Array2D<Imf_2_5::Rgba> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
             ,CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
            ((Array2D<Imf_2_5::Rgba> *)(local_100 + 1),(long)-iVar17);
  Imf_2_5::RgbaInputFile::setFrameBuffer
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  Imf_2_5::RgbaInputFile::readPixels
            ((RgbaInputFile *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),(int)in_stack_fffffffffffffdd8);
  Imf_2_5::RgbaInputFile::displayWindow((RgbaInputFile *)0x1f64d1);
  Imf_2_5::Header::displayWindow((Header *)0x1f64e8);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffdc8);
  if (!bVar1) {
    __assert_fail("in.displayWindow() == header.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                  ,0x8b,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)0x1f658a);
  Imf_2_5::Header::dataWindow((Header *)0x1f65a1);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffdc8);
  if (!bVar1) {
    __assert_fail("in.dataWindow() == header.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                  ,0x8c,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  fVar15 = Imf_2_5::RgbaInputFile::pixelAspectRatio((RgbaInputFile *)0x1f6604);
  pfVar12 = Imf_2_5::Header::pixelAspectRatio((Header *)0x1f661c);
  if ((fVar15 != *pfVar12) || (NAN(fVar15) || NAN(*pfVar12))) {
    __assert_fail("in.pixelAspectRatio() == header.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                  ,0x8d,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  Imf_2_5::RgbaInputFile::screenWindowCenter(in_stack_fffffffffffffdc8);
  v = Imf_2_5::Header::screenWindowCenter((Header *)0x1f6683);
  bVar1 = Imath_2_5::Vec2<float>::operator==(local_100,v);
  if (!bVar1) {
    __assert_fail("in.screenWindowCenter() == header.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                  ,0x8e,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  fVar15 = Imf_2_5::RgbaInputFile::screenWindowWidth((RgbaInputFile *)0x1f66e6);
  pfVar12 = Imf_2_5::Header::screenWindowWidth((Header *)0x1f66fe);
  if ((fVar15 != *pfVar12) || (NAN(fVar15) || NAN(*pfVar12))) {
    __assert_fail("in.screenWindowWidth() == header.screenWindowWidth()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                  ,0x8f,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  LVar4 = Imf_2_5::RgbaInputFile::lineOrder((RgbaInputFile *)0x1f674e);
  pLVar9 = Imf_2_5::Header::lineOrder((Header *)0x1f6761);
  if (LVar4 != *pLVar9) {
    __assert_fail("in.lineOrder() == header.lineOrder()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                  ,0x90,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  CVar5 = Imf_2_5::RgbaInputFile::compression((RgbaInputFile *)0x1f67a3);
  pCVar10 = Imf_2_5::Header::compression((Header *)0x1f67b6);
  if (CVar5 == *pCVar10) {
    width_00 = Imf_2_5::RgbaInputFile::channels
                         ((RgbaInputFile *)
                          CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    if (width_00 != in_R8D) {
      __assert_fail("in.channels() == channels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                    ,0x92,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                   );
    }
    CVar5 = Imf_2_5::RgbaInputFile::compression((RgbaInputFile *)0x1f6839);
    if ((CVar5 == B44_COMPRESSION) ||
       (CVar6 = Imf_2_5::RgbaInputFile::compression((RgbaInputFile *)0x1f6855),
       CVar6 == B44A_COMPRESSION)) {
      compareB44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
    else {
      CVar7 = Imf_2_5::RgbaInputFile::compression((RgbaInputFile *)0x1f68a3);
      if ((CVar7 == DWAA_COMPRESSION) ||
         (in_stack_fffffffffffffe04 =
               (float)Imf_2_5::RgbaInputFile::compression((RgbaInputFile *)0x1f68bf),
         in_stack_fffffffffffffe04 == 1.26117e-44)) {
        compareDwa(width_00,CVar5,(Array2D<Imf_2_5::Rgba> *)CONCAT44(CVar6,CVar7),
                   (Array2D<Imf_2_5::Rgba> *)
                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),channels_00);
      }
      else {
        for (local_104 = 0; local_104 < iVar3; local_104 = local_104 + 1) {
          for (local_108 = 0; local_108 < iVar2; local_108 = local_108 + 1) {
            if ((in_R8D & WRITE_R) == 0) {
              pRVar13 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                  ((Array2D<Imf_2_5::Rgba> *)(local_100 + 1),(long)local_104);
              fVar15 = half::operator_cast_to_float(&pRVar13[local_108].r);
              if ((fVar15 != 0.0) || (NAN(fVar15))) {
                __assert_fail("p2[y][x].r == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                              ,0xa7,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
            else {
              pRVar13 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                  ((Array2D<Imf_2_5::Rgba> *)(local_100 + 1),(long)local_104);
              fVar15 = half::operator_cast_to_float(&pRVar13[local_108].r);
              pRVar13 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](in_RCX,(long)local_104);
              fVar16 = half::operator_cast_to_float(&pRVar13[local_108].r);
              if ((fVar15 != fVar16) || (NAN(fVar15) || NAN(fVar16))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                              ,0xa5,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
            if ((in_R8D & WRITE_G) == 0) {
              pRVar13 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                  ((Array2D<Imf_2_5::Rgba> *)(local_100 + 1),(long)local_104);
              fVar15 = half::operator_cast_to_float(&pRVar13[local_108].g);
              if ((fVar15 != 0.0) || (NAN(fVar15))) {
                __assert_fail("p2[y][x].g == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                              ,0xac,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
            else {
              pRVar13 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                  ((Array2D<Imf_2_5::Rgba> *)(local_100 + 1),(long)local_104);
              fVar15 = half::operator_cast_to_float(&pRVar13[local_108].g);
              pRVar13 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](in_RCX,(long)local_104);
              fVar16 = half::operator_cast_to_float(&pRVar13[local_108].g);
              if ((fVar15 != fVar16) || (NAN(fVar15) || NAN(fVar16))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                              ,0xaa,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
            if ((in_R8D & WRITE_B) == 0) {
              pRVar13 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                  ((Array2D<Imf_2_5::Rgba> *)(local_100 + 1),(long)local_104);
              fVar15 = half::operator_cast_to_float(&pRVar13[local_108].b);
              if ((fVar15 != 0.0) || (NAN(fVar15))) {
                __assert_fail("p2[y][x].b == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                              ,0xb1,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
            else {
              pRVar13 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                  ((Array2D<Imf_2_5::Rgba> *)(local_100 + 1),(long)local_104);
              in_stack_fffffffffffffdd4 = half::operator_cast_to_float(&pRVar13[local_108].b);
              pRVar13 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](in_RCX,(long)local_104);
              fVar15 = half::operator_cast_to_float(&pRVar13[local_108].b);
              if ((in_stack_fffffffffffffdd4 != fVar15) ||
                 (NAN(in_stack_fffffffffffffdd4) || NAN(fVar15))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                              ,0xaf,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
            if ((in_R8D & WRITE_A) == 0) {
              pRVar13 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                  ((Array2D<Imf_2_5::Rgba> *)(local_100 + 1),(long)local_104);
              fVar15 = half::operator_cast_to_float(&pRVar13[local_108].a);
              if ((fVar15 != 1.0) || (NAN(fVar15))) {
                __assert_fail("p2[y][x].a == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                              ,0xb6,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
            else {
              pRVar13 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                  ((Array2D<Imf_2_5::Rgba> *)(local_100 + 1),(long)local_104);
              in_stack_fffffffffffffdc4 = half::operator_cast_to_float(&pRVar13[local_108].a);
              pRVar13 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](in_RCX,(long)local_104);
              fVar15 = half::operator_cast_to_float(&pRVar13[local_108].a);
              if ((in_stack_fffffffffffffdc4 != fVar15) ||
                 (NAN(in_stack_fffffffffffffdc4) || NAN(fVar15))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                              ,0xb4,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
            }
          }
        }
      }
    }
    Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D
              ((Array2D<Imf_2_5::Rgba> *)
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    Imf_2_5::RgbaInputFile::~RgbaInputFile
              ((RgbaInputFile *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    remove(in_RDI);
    Imf_2_5::Header::~Header
              ((Header *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    return;
  }
  __assert_fail("in.compression() == header.compression()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                ,0x91,
                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
               );
}

Assistant:

void
writeReadRGBA (const char fileName[],
	       int width,
	       int height,
	       const Array2D<Rgba> &p1,
	       RgbaChannels channels,
	       LineOrder lorder,
	       Compression comp)
{
    //
    // Save the selected channels of RGBA image p1; save the
    // scan lines in the specified order.  Read the image back
    // from the file, and compare the data with the orignal.
    //

    cout << "channels " <<
	    ((channels & WRITE_R)? "R": "") <<
	    ((channels & WRITE_G)? "G": "") <<
	    ((channels & WRITE_B)? "B": "") <<
	    ((channels & WRITE_A)? "A": "") <<
	    ", line order " << lorder <<
	    ", compression " << comp << endl;

    Header header (width, height);
    header.lineOrder() = lorder;
    header.compression() = comp;

    {
	remove (fileName);
	RgbaOutputFile out (fileName, header, channels);
        out.setFrameBuffer (&p1[0][0], 1, width);
        
        int numLeft = height;
        int numWrite = 1;

	//
        // Iterate over all scanlines, and write them out in random-size chunks
	//

        while (numLeft)
        {
            numWrite = int (rand1.nextf() * numLeft + 0.5f);
            out.writePixels (numWrite);
            numLeft -= numWrite;
        }
    }

    {
	RgbaInputFile in (fileName);
	const Box2i &dw = in.dataWindow();
	
	int w = dw.max.x - dw.min.x + 1;
	int h = dw.max.y - dw.min.y + 1;
	int dx = dw.min.x;
	int dy = dw.min.y;

	Array2D<Rgba> p2 (h, w);
	in.setFrameBuffer (&p2[-dy][-dx], 1, w);
	in.readPixels (dw.min.y, dw.max.y);

	assert (in.displayWindow() == header.displayWindow());
	assert (in.dataWindow() == header.dataWindow());
	assert (in.pixelAspectRatio() == header.pixelAspectRatio());
	assert (in.screenWindowCenter() == header.screenWindowCenter());
	assert (in.screenWindowWidth() == header.screenWindowWidth());
	assert (in.lineOrder() == header.lineOrder());
	assert (in.compression() == header.compression());
	assert (in.channels() == channels);

	if (in.compression() == B44_COMPRESSION ||
	    in.compression() == B44A_COMPRESSION)
	{
	    compareB44 (w, h, p1, p2, channels);
	}
	else if (in.compression() == DWAA_COMPRESSION ||
	         in.compression() == DWAB_COMPRESSION)
	{
	    compareDwa (w, h, p1, p2, channels);
	}
	else
	{
	    for (int y = 0; y < h; ++y)
	    {
		for (int x = 0; x < w; ++x)
		{
		    if (channels & WRITE_R)
			assert (p2[y][x].r == p1[y][x].r);
		    else
			assert (p2[y][x].r == 0);

		    if (channels & WRITE_G)
			assert (p2[y][x].g == p1[y][x].g);
		    else
			assert (p2[y][x].g == 0);

		    if (channels & WRITE_B)
			assert (p2[y][x].b == p1[y][x].b);
		    else
			assert (p2[y][x].b == 0);

		    if (channels & WRITE_A)
			assert (p2[y][x].a == p1[y][x].a);
		    else
			assert (p2[y][x].a == 1);
		}
	    }
	}
    }

    remove (fileName);
}